

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O1

size_t __thiscall Creature::mutate(Creature *this,double prob)

{
  size_t sVar1;
  size_t sVar2;
  pointer psVar3;
  double dVar4;
  
  psVar3 = (this->chroms).
           super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 == (this->chroms).
                super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      if (psVar3->px == (Chromosome *)0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Chromosome>::operator->() const [T = Chromosome]"
                     );
      }
      sVar1 = Chromosome::mutate(psVar3->px,prob);
      sVar2 = sVar2 + sVar1;
      psVar3 = psVar3 + 1;
    } while (psVar3 != (this->chroms).
                       super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (sVar2 != 0) {
    dVar4 = make_fitness(this);
    this->fitness = dVar4;
  }
  return sVar2;
}

Assistant:

size_t Creature::mutate( double prob )
{
	size_t flipctr = 0;

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		flipctr += (*it)->mutate(prob);
	}

	if(flipctr)
		fitness = make_fitness();

	return flipctr;
}